

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_steal_random_WRAP(WorkerP *w,Task *__dq_head,TD_lace_steal_random *t)

{
  TD_lace_steal_random *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  lace_steal_random_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(lace_steal_random)
{
    YIELD_NEWFRAME();

    if (unlikely(atomic_load_explicit(&external_task, memory_order_acquire) != 0)) {
        lace_steal_external(__lace_worker, __lace_dq_head);
    } else if (n_workers > 1) {
        Worker *victim = workers[(__lace_worker->worker + 1 + rng(&__lace_worker->seed, n_workers-1)) % n_workers];

        PR_COUNTSTEALS(__lace_worker, CTR_steal_tries);
        Worker *res = lace_steal(__lace_worker, __lace_dq_head, victim);
        if (res == LACE_STOLEN) {
            PR_COUNTSTEALS(__lace_worker, CTR_steals);
        } else if (res == LACE_BUSY) {
            PR_COUNTSTEALS(__lace_worker, CTR_steal_busy);
        }
    }
}